

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O3

nbt_node * nbt_find(nbt_node *tree,nbt_predicate_t predicate,void *aux)

{
  _Bool _Var1;
  nbt_node *pnVar2;
  list_head *plVar3;
  list_head *plVar4;
  
  if (tree != (nbt_node *)0x0) {
    _Var1 = (*predicate)(tree,aux);
    if (_Var1) {
      return tree;
    }
    if (tree->type - TAG_LIST < 2) {
      plVar4 = (((tree->payload).tag_list)->entry).flink;
      plVar3 = &((tree->payload).tag_list)->entry;
      if (plVar4 != plVar3) {
        do {
          pnVar2 = nbt_find((nbt_node *)plVar4[-1].flink,predicate,aux);
          if (pnVar2 != (nbt_node *)0x0) {
            return pnVar2;
          }
          plVar4 = plVar4->flink;
        } while (plVar4 != plVar3);
        return (nbt_node *)0x0;
      }
    }
  }
  return (nbt_node *)0x0;
}

Assistant:

nbt_node* nbt_find(nbt_node* tree, nbt_predicate_t predicate, void* aux)
{
    if(tree == NULL)                  return NULL;
    if(predicate(tree, aux))          return tree;
    if(tree->type != TAG_LIST &&
       tree->type != TAG_COMPOUND)    return NULL;

    struct list_head* pos;
    struct nbt_list* list = tree->type == TAG_LIST ? tree->payload.tag_list : tree->payload.tag_compound;
    
    list_for_each(pos, &list->entry)
    {
        struct nbt_list* p = list_entry(pos, struct nbt_list, entry);
        struct nbt_node* found;

        if((found = nbt_find(p->data, predicate, aux)))
            return found;
    }

    return NULL;
}